

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

AliasRet aa_fref(jit_State *J,IRIns *refa,IRIns *refb)

{
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  IRIns *ir;
  AliasRet AVar4;
  IRIns *stop;
  byte bVar5;
  byte bVar6;
  
  AVar4 = ALIAS_NO;
  if ((refa->field_0).op2 == (refb->field_0).op2) {
    uVar1 = (refa->field_0).op1;
    uVar2 = (refb->field_0).op1;
    if (uVar1 == uVar2) {
      return ALIAS_MUST;
    }
    if ((ushort)((refa->field_0).op2 - 3) < 6) {
      pIVar3 = (J->cur).ir;
      bVar6 = *(byte *)((long)pIVar3 + (ulong)uVar1 * 8 + 5) & 0xfe;
      bVar5 = *(byte *)((long)pIVar3 + (ulong)uVar2 * 8 + 5) & 0xfe;
      if ((bVar6 == 0x4e) && (bVar5 == 0x4e)) {
        return ALIAS_NO;
      }
      if ((bVar5 != 0x4e) && (bVar6 != 0x4e)) {
        return ALIAS_MAY;
      }
      stop = pIVar3 + uVar2;
      ir = pIVar3 + uVar1;
      if (bVar5 == 0x4e) {
        stop = pIVar3 + uVar1;
        ir = pIVar3 + uVar2;
      }
      AVar4 = aa_escape(J,ir,stop);
      return AVar4;
    }
    AVar4 = ALIAS_MAY;
  }
  return AVar4;
}

Assistant:

static AliasRet aa_fref(jit_State *J, IRIns *refa, IRIns *refb)
{
  if (refa->op2 != refb->op2)
    return ALIAS_NO;  /* Different fields. */
  if (refa->op1 == refb->op1)
    return ALIAS_MUST;  /* Same field, same object. */
  else if (refa->op2 >= IRFL_TAB_META && refa->op2 <= IRFL_TAB_NOMM)
    return aa_table(J, refa->op1, refb->op1);  /* Disambiguate tables. */
  else
    return ALIAS_MAY;  /* Same field, possibly different object. */
}